

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O1

bool __thiscall MinVR::element::add_attribute(element *this,attribute *ptr_attribute)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  if (ptr_attribute != (attribute *)0x0) {
    p_Var2 = (_List_node_base *)operator_new(0x18);
    p_Var2[1]._M_next = (_List_node_base *)ptr_attribute;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    psVar1 = &(this->m_attribute_list).
              super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    (this->m_attribute_iterator)._M_node =
         (this->m_attribute_list).
         super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>._M_impl._M_node.
         super__List_node_base._M_next;
    this->is_empty_attribute_list = false;
  }
  return ptr_attribute != (attribute *)0x0;
}

Assistant:

bool element::add_attribute(attribute* ptr_attribute)
{
    if(ptr_attribute == NULL)
        return false;
    m_attribute_list.push_back(ptr_attribute);
    m_attribute_iterator = m_attribute_list.begin();
    is_empty_attribute_list = false;
    return true;
}